

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManComputeCuts(Aig_Man_t *p,int Num,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  Vec_Ptr_t *vUpper;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *vResult;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  Vec_Ptr_t *vLower;
  timespec ts;
  long local_78;
  ulong local_70;
  long local_58;
  long local_48;
  timespec local_40;
  
  iVar3 = p->nObjs[6];
  iVar8 = p->nObjs[5];
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    local_58 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_58 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vResult = (Vec_Ptr_t *)malloc(0x10);
  vResult->nCap = 100;
  vResult->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vResult->pArray = ppvVar4;
  pVVar5 = Llb_ManComputeCutLo(p);
  vResult->nSize = 1;
  *ppvVar4 = pVVar5;
  pVVar5 = Llb_ManComputeCutLi(p);
  if (vResult->nCap == 1) {
    ppvVar4 = (void **)realloc(ppvVar4,0x80);
    vResult->pArray = ppvVar4;
    vResult->nCap = 0x10;
  }
  ppvVar4 = vResult->pArray;
  vResult->nSize = 2;
  ppvVar4[1] = pVVar5;
  local_70 = 2;
  local_78 = 0;
  local_48 = 0;
  pVVar5 = (Vec_Ptr_t *)0x0;
  do {
    uVar7 = 1;
    vLower = (Vec_Ptr_t *)*ppvVar4;
    do {
      vUpper = (Vec_Ptr_t *)ppvVar4[uVar7];
      iVar2 = Llb_ManCutVolume(p,vLower,vUpper);
      if ((iVar3 + iVar8) / Num < iVar2) {
        if (fVeryVerbose != 0) {
          Llb_ManCutPrint(p,vLower,vUpper);
        }
        pVVar5 = Llb_ManFlowFindBestCut(p,vLower,vUpper,Num);
        if (pVVar5 != (Vec_Ptr_t *)0x0) {
          if (fVeryVerbose != 0) {
            Llb_ManCutPrint(p,pVVar5,vUpper);
            Llb_ManCutPrint(p,vLower,pVVar5);
            putchar(10);
          }
          break;
        }
        if (fVeryVerbose != 0) {
          puts("Could not break the cut.");
          putchar(10);
        }
        pVVar5 = (Vec_Ptr_t *)0x0;
      }
      lVar6 = local_48 + uVar7;
      uVar7 = uVar7 + 1;
      vLower = vUpper;
    } while (lVar6 != 1);
    iVar2 = (int)uVar7;
    if ((uVar7 & 0xffffffff) == local_70) {
      vResult->pArray = ppvVar4;
      vResult->nSize = (int)local_70;
      if (fVerbose != 0) {
        printf("Finished computing %d partitions.  ",(ulong)((int)local_70 - 1));
        iVar8 = 3;
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        Abc_Print(iVar8,"%s =","Time");
        Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar6 + local_58) / 1000000.0);
        Llb_ManResultPrint(p,vResult);
      }
      return vResult;
    }
    uVar1 = vResult->nCap;
    if (local_70 == uVar1) {
      if ((int)uVar1 < 0x10) {
        ppvVar4 = (void **)realloc(ppvVar4,0x80);
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar1 * 2;
        if (iVar9 <= (int)uVar1) goto LAB_00823fee;
        ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar1 << 4);
      }
      vResult->nCap = iVar9;
    }
LAB_00823fee:
    ppvVar4[local_70] = (void *)0x0;
    iVar9 = (int)(local_70 + 1);
    lVar6 = local_78;
    if ((long)iVar2 < (long)local_70) {
      do {
        if ((int)lVar6 + 3 < 2) {
          vResult->pArray = ppvVar4;
          vResult->nSize = iVar9;
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar4[lVar6 + 2U & 0xffffffff] = ppvVar4[lVar6 + 1];
        lVar6 = lVar6 + -1;
      } while (iVar2 < (int)lVar6 + 2);
    }
    if ((long)local_70 < (long)iVar2) {
      vResult->pArray = ppvVar4;
      vResult->nSize = iVar9;
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    ppvVar4[uVar7 & 0xffffffff] = pVVar5;
    local_48 = local_48 + -1;
    local_78 = local_78 + 1;
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCuts( Aig_Man_t * p, int Num, int fVerbose, int fVeryVerbose )
{
    int nVolMax = Aig_ManNodeNum(p) / Num;
    Vec_Ptr_t * vResult, * vMinCut = NULL, * vLower, * vUpper;
    int i, k, nVol;
    abctime clk = Abc_Clock();
    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vResult, Llb_ManComputeCutLo(p) );
    Vec_PtrPush( vResult, Llb_ManComputeCutLi(p) );
    while ( 1 ) 
    {
        // find a place to insert new cut
        vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
        Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
        {
            nVol = Llb_ManCutVolume( p, vLower, vUpper );
            if ( nVol <= nVolMax )
            {
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vUpper );
            vMinCut = Llb_ManFlowFindBestCut( p, vLower, vUpper, Num );
            if ( vMinCut == NULL )
            {
                if ( fVeryVerbose )
                printf( "Could not break the cut.\n" );
                if ( fVeryVerbose )
                printf( "\n" );
                vLower = vUpper;
                continue;
            }

            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vMinCut, vUpper );
            if ( fVeryVerbose )
            Llb_ManCutPrint( p, vLower,  vMinCut );
            if ( fVeryVerbose )
            printf( "\n" );

            break;
        }
        if ( i == Vec_PtrSize(vResult) )
            break;
        // insert vMinCut before vUpper
        Vec_PtrPush( vResult, NULL );
        for ( k = Vec_PtrSize(vResult) - 1; k > i; k-- )
            Vec_PtrWriteEntry( vResult, k, Vec_PtrEntry(vResult, k-1) );
        Vec_PtrWriteEntry( vResult, i, vMinCut );
    }
    if ( fVerbose )
    {
        printf( "Finished computing %d partitions.  ", Vec_PtrSize(vResult) - 1 );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        Llb_ManResultPrint( p, vResult );
    }
    return vResult;
}